

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

TriangleLight *
embree::SceneGraph::TriangleLight::lerp
          (TriangleLight *__return_storage_ptr__,TriangleLight *light0,TriangleLight *light1,float f
          )

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  
  fVar33 = 1.0 - f;
  fVar1 = (light1->v0).field_0.m128[0];
  fVar2 = (light1->v0).field_0.m128[1];
  fVar3 = (light1->v0).field_0.m128[2];
  fVar4 = (light1->v0).field_0.m128[3];
  fVar5 = (light0->v0).field_0.m128[0];
  fVar6 = (light0->v0).field_0.m128[1];
  fVar7 = (light0->v0).field_0.m128[2];
  fVar8 = (light0->v0).field_0.m128[3];
  fVar9 = (light1->v1).field_0.m128[0];
  fVar10 = (light1->v1).field_0.m128[1];
  fVar11 = (light1->v1).field_0.m128[2];
  fVar12 = (light1->v1).field_0.m128[3];
  fVar13 = (light0->v1).field_0.m128[0];
  fVar14 = (light0->v1).field_0.m128[1];
  fVar15 = (light0->v1).field_0.m128[2];
  fVar16 = (light0->v1).field_0.m128[3];
  fVar17 = (light1->v2).field_0.m128[0];
  fVar18 = (light1->v2).field_0.m128[1];
  fVar19 = (light1->v2).field_0.m128[2];
  fVar20 = (light1->v2).field_0.m128[3];
  fVar21 = (light0->v2).field_0.m128[0];
  fVar22 = (light0->v2).field_0.m128[1];
  fVar23 = (light0->v2).field_0.m128[2];
  fVar24 = (light0->v2).field_0.m128[3];
  fVar25 = (light1->L).field_0.m128[0];
  fVar26 = (light1->L).field_0.m128[1];
  fVar27 = (light1->L).field_0.m128[2];
  fVar28 = (light1->L).field_0.m128[3];
  fVar29 = (light0->L).field_0.m128[0];
  fVar30 = (light0->L).field_0.m128[1];
  fVar31 = (light0->L).field_0.m128[2];
  fVar32 = (light0->L).field_0.m128[3];
  (__return_storage_ptr__->super_Light).type = LIGHT_TRIANGLE;
  (__return_storage_ptr__->v0).field_0.m128[0] = fVar5 * fVar33 + fVar1 * f;
  (__return_storage_ptr__->v0).field_0.m128[1] = fVar6 * fVar33 + fVar2 * f;
  (__return_storage_ptr__->v0).field_0.m128[2] = fVar7 * fVar33 + fVar3 * f;
  (__return_storage_ptr__->v0).field_0.m128[3] = fVar8 * fVar33 + fVar4 * f;
  (__return_storage_ptr__->v1).field_0.m128[0] = fVar13 * fVar33 + fVar9 * f;
  (__return_storage_ptr__->v1).field_0.m128[1] = fVar14 * fVar33 + fVar10 * f;
  (__return_storage_ptr__->v1).field_0.m128[2] = fVar15 * fVar33 + fVar11 * f;
  (__return_storage_ptr__->v1).field_0.m128[3] = fVar16 * fVar33 + fVar12 * f;
  (__return_storage_ptr__->v2).field_0.m128[0] = fVar21 * fVar33 + fVar17 * f;
  (__return_storage_ptr__->v2).field_0.m128[1] = fVar22 * fVar33 + fVar18 * f;
  (__return_storage_ptr__->v2).field_0.m128[2] = fVar23 * fVar33 + fVar19 * f;
  (__return_storage_ptr__->v2).field_0.m128[3] = fVar24 * fVar33 + fVar20 * f;
  (__return_storage_ptr__->L).field_0.m128[0] = fVar33 * fVar29 + f * fVar25;
  (__return_storage_ptr__->L).field_0.m128[1] = fVar33 * fVar30 + f * fVar26;
  (__return_storage_ptr__->L).field_0.m128[2] = fVar33 * fVar31 + f * fVar27;
  (__return_storage_ptr__->L).field_0.m128[3] = fVar33 * fVar32 + f * fVar28;
  return __return_storage_ptr__;
}

Assistant:

static TriangleLight lerp(const TriangleLight& light0, const TriangleLight& light1, const float f)
      {
        return TriangleLight(embree::lerp(light0.v0,light1.v0,f),
                             embree::lerp(light0.v1,light1.v1,f),
                             embree::lerp(light0.v2,light1.v2,f),
                             embree::lerp(light0.L,light1.L,f));
      }